

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O2

void Diligent::
     FormatStrSS<std::__cxx11::stringstream,char[10],char_const*,char[47],std::__cxx11::string,char[80],std::__cxx11::string,char[250]>
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss,
               char (*FirstArg) [10],char **RestArgs,char (*RestArgs_1) [47],
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *RestArgs_2,
               char (*RestArgs_3) [80],
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *RestArgs_4,
               char (*RestArgs_5) [250])

{
  std::operator<<((ostream *)(ss + 0x10),*FirstArg);
  FormatStrSS<std::__cxx11::stringstream,char_const*,char[47],std::__cxx11::string,char[80],std::__cxx11::string,char[250]>
            (ss,RestArgs,RestArgs_1,RestArgs_2,RestArgs_3,RestArgs_4,RestArgs_5);
  return;
}

Assistant:

void FormatStrSS(SSType& ss, const FirstArgType& FirstArg, const RestArgsType&... RestArgs)
{
    FormatStrSS(ss, FirstArg);
    FormatStrSS(ss, RestArgs...); // recursive call using pack expansion syntax
}